

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::GetProperty_Internal<false>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,Var originalInstance,
          PropertyId propertyId,Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint32 index;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  int local_54;
  DictionaryPropertyDescriptor<int> *pDStack_50;
  int i;
  DictionaryPropertyDescriptor<int> *descriptor;
  PropertyRecord *propertyRecord;
  Var local_38;
  
  propertyRecord = (PropertyRecord *)info;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    local_38 = originalInstance;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x233,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    originalInstance = local_38;
  }
  descriptor = (DictionaryPropertyDescriptor<int> *)
               ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,(PropertyRecord **)&descriptor,
                     &stack0xffffffffffffffb0,&local_54);
  if (bVar2) {
    BVar3 = GetPropertyFromDescriptor<false,int>
                      (this,instance,originalInstance,pDStack_50,value,
                       (PropertyValueInfo *)propertyRecord,propertyId,requestContext);
  }
  else {
    bVar2 = DynamicObject::HasObjectArray(instance);
    if ((bVar2) && (descriptor[1].flags == PreventFalseReference)) {
      index = PropertyRecord::GetNumericValue((PropertyRecord *)descriptor);
      BVar3 = DynamicTypeHandler::GetItem
                        (&this->super_DynamicTypeHandler,instance,originalInstance,index,value,
                         requestContext);
    }
    else {
      pRVar5 = ScriptContext::GetMissingPropertyResult(requestContext);
      *value = pRVar5;
      BVar3 = 0;
    }
  }
  return BVar3;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::GetProperty_Internal(DynamicObject* instance, Var originalInstance, PropertyId propertyId,
        Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            return GetPropertyFromDescriptor<allowLetConstGlobal>(instance, originalInstance, descriptor, value, info, propertyId, requestContext);
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return DictionaryTypeHandlerBase<T>::GetItem(instance, originalInstance, propertyRecord->GetNumericValue(), value, requestContext);
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }